

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::
     checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
               (Builder reader,initializer_list<capnp::Text::Reader> expected)

{
  Exception *__s1;
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  Fault f;
  Reader local_58;
  Builder local_48;
  
  uVar4 = expected._M_len;
  if (reader.builder.elementCount == uVar4) {
    if (uVar4 != 0) {
      uVar3 = 0;
      uVar5 = 1;
      do {
        __s1 = (Exception *)expected._M_array[uVar3].super_StringPtr.content.ptr;
        sVar1 = expected._M_array[uVar3].super_StringPtr.content.size_;
        f.exception = (Exception *)reader.builder.segment;
        PointerBuilder::getBlob<capnp::Text>(&local_48,(PointerBuilder *)&f,(void *)0x0,0);
        local_58.super_StringPtr.content.ptr = local_48.content.ptr;
        local_58.super_StringPtr.content.size_ = local_48.content.size_;
        f.exception = __s1;
        if (((sVar1 != local_48.content.size_) ||
            (iVar2 = bcmp(__s1,local_48.content.ptr,sVar1 - 1), iVar2 != 0)) &&
           (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::log<char_const(&)[28],capnp::Text::Reader&,capnp::Text::Reader&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
                     (char (*) [28])"failed: expected (a) == (b)",(Reader *)&f,&local_58);
        }
        bVar6 = uVar5 < uVar4;
        uVar3 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar6);
    }
    return;
  }
  local_58.super_StringPtr.content.ptr =
       (char *)CONCAT44(local_58.super_StringPtr.content.ptr._4_4_,reader.builder.elementCount);
  local_48._0_8_ = uVar4;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             (unsigned_long *)&local_48,(uint *)&local_58);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}